

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O0

bool __thiscall
HighsHashTable<std::tuple<int,int,unsigned_int>,void>::insert<int&,int&,unsigned_int&>
          (HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *this,int *args,int *args_1,
          uint *args_2)

{
  ulong uVar1;
  bool bVar2;
  type puVar3;
  ulong uVar4;
  HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void> *__a;
  u64 uVar5;
  HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *in_RCX;
  HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *in_RDI;
  u64 distanceOfCurrentOccupant;
  u64 currentDistance;
  Entry *entryArray;
  u8 meta;
  u64 maxPos;
  u64 startPos;
  u64 pos;
  Entry entry;
  HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void> *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void> *in_stack_ffffffffffffff90;
  uchar local_51;
  HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *in_stack_ffffffffffffffb0;
  HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void> *in_stack_ffffffffffffffb8;
  HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *in_stack_ffffffffffffffc0;
  u8 *in_stack_ffffffffffffffc8;
  KeyType *in_stack_ffffffffffffffd0;
  bool local_1;
  
  HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>::
  HighsHashTableEntry<int_&,_int_&,_unsigned_int_&,_0>
            (in_stack_ffffffffffffff90,(int *)in_RDI,
             (int *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
             (uint *)in_stack_ffffffffffffff78);
  HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>::key
            ((HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void> *)
             &stack0xffffffffffffffcc);
  bVar2 = HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::findPosition
                    (in_RCX,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                     (u64 *)in_stack_ffffffffffffffc0,(u64 *)in_stack_ffffffffffffffb8,
                     (u64 *)in_stack_ffffffffffffffb0);
  if (bVar2) {
    local_1 = false;
  }
  else if ((in_RDI->numElements == (in_RDI->tableSizeMask + 1) * 7 >> 3) ||
          (in_stack_ffffffffffffffc0 == in_stack_ffffffffffffffb0)) {
    HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::growTable(in_stack_ffffffffffffffb0);
    local_1 = insert<HighsHashTableEntry<std::tuple<int,int,unsigned_int>,void>>
                        (in_RCX,(HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void> *)
                                in_stack_ffffffffffffffd0);
  }
  else {
    std::
    unique_ptr<HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>,_HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::OpNewDeleter>
    ::get((unique_ptr<HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>,_HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::OpNewDeleter>
           *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    in_RDI->numElements = in_RDI->numElements + 1;
    do {
      puVar3 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                          CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                          (size_t)in_stack_ffffffffffffff78);
      bVar2 = HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::occupied(in_RDI,*puVar3);
      if (!bVar2) {
        puVar3 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            CONCAT17(local_51,in_stack_ffffffffffffff80),
                            (size_t)in_stack_ffffffffffffff78);
        *puVar3 = local_51;
        HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>::HighsHashTableEntry
                  ((HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void> *)
                   CONCAT17(local_51,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78);
        return true;
      }
      uVar4 = (long)in_stack_ffffffffffffffc0 - (long)in_stack_ffffffffffffffb8;
      uVar1 = in_RDI->tableSizeMask;
      __a = (HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void> *)
            HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::distanceFromIdealSlot
                      ((HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)
                       CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                       (u64)in_stack_ffffffffffffff78);
      if (__a < (HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void> *)(uVar4 & uVar1)) {
        std::swap<HighsHashTableEntry<std::tuple<int,int,unsigned_int>,void>>
                  (__a,(HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void> *)in_RDI);
        puVar3 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                            CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                            (size_t)in_stack_ffffffffffffff78);
        std::swap<unsigned_char>(&local_51,puVar3);
        in_stack_ffffffffffffff78 =
             (HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void> *)
             ((long)in_stack_ffffffffffffffc0 - (long)__a & in_RDI->tableSizeMask);
        in_stack_ffffffffffffffb8 = in_stack_ffffffffffffff78;
        uVar5 = HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::maxDistance();
        in_stack_ffffffffffffffb0 =
             (HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)
             ((long)&(in_stack_ffffffffffffff78->value_).
                     super__Tuple_impl<0UL,_int,_int,_unsigned_int>.
                     super__Tuple_impl<1UL,_int,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
                     super__Head_base<2UL,_unsigned_int,_false>._M_head_impl + uVar5 &
             in_RDI->tableSizeMask);
      }
      in_stack_ffffffffffffffc0 =
           (HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void> *)
           ((ulong)((long)&(in_stack_ffffffffffffffc0->entries)._M_t.
                           super___uniq_ptr_impl<HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>,_HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::OpNewDeleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>_*,_HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::OpNewDeleter>
                           .
                           super__Head_base<0UL,_HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void>_*,_false>
                           ._M_head_impl + 1U) & in_RDI->tableSizeMask);
    } while (in_stack_ffffffffffffffc0 != in_stack_ffffffffffffffb0);
    HighsHashTable<std::tuple<int,_int,_unsigned_int>,_void>::growTable(in_stack_ffffffffffffffb0);
    insert<HighsHashTableEntry<std::tuple<int,int,unsigned_int>,void>>
              (in_RCX,(HighsHashTableEntry<std::tuple<int,_int,_unsigned_int>,_void> *)
                      in_stack_ffffffffffffffd0);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool insert(Args&&... args) {
    Entry entry(std::forward<Args>(args)...);

    u64 pos, startPos, maxPos;
    u8 meta;
    if (findPosition(entry.key(), meta, startPos, maxPos, pos)) return false;

    if (numElements == ((tableSizeMask + 1) * 7) / 8 || pos == maxPos) {
      growTable();
      return insert(std::move(entry));
    }

    using std::swap;
    Entry* entryArray = entries.get();
    ++numElements;

    do {
      if (!occupied(metadata[pos])) {
        metadata[pos] = meta;
        new (&entryArray[pos]) Entry{std::move(entry)};
        return true;
      }

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      u64 distanceOfCurrentOccupant = distanceFromIdealSlot(pos);
      if (currentDistance > distanceOfCurrentOccupant) {
        // steal the position
        swap(entry, entryArray[pos]);
        swap(meta, metadata[pos]);

        startPos = (pos - distanceOfCurrentOccupant) & tableSizeMask;
        maxPos = (startPos + maxDistance()) & tableSizeMask;
      }
      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    growTable();
    insert(std::move(entry));
    return true;
  }